

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_histogram.cpp
# Opt level: O1

void Omega_h::render_histogram_matplotlib(Histogram *histogram,string *filepath)

{
  ulong uVar1;
  double dVar2;
  pointer plVar3;
  pointer plVar4;
  int iVar5;
  ostream *poVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  bool bVar10;
  double dVar11;
  ofstream script;
  double local_258;
  double local_240;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream((ostream *)&local_230,"Omega_h_histogram.py",_S_out);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,"#!/usr/bin/python\n",0x12);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,"import matplotlib\n",0x12);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,"# Force matplotlib to not use any Xwindows backend.\n",0x34);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,"matplotlib.use(\'Agg\')\n",0x16);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,"import matplotlib.pyplot as plt\n",0x20);
  plVar3 = (histogram->bins).super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  plVar4 = (histogram->bins).super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_start;
  dVar11 = histogram->max;
  dVar2 = histogram->min;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"a = [",5);
  uVar8 = (uint)((ulong)((long)plVar3 - (long)plVar4) >> 3);
  if ((int)uVar8 < 1) {
    local_240 = 0.0;
  }
  else {
    dVar11 = (dVar11 - dVar2) / (double)(int)uVar8;
    lVar9 = 0;
    uVar7 = 0;
    do {
      std::ostream::_M_insert<double>((double)(int)uVar7 * dVar11 + histogram->min + dVar11 * 0.5);
      uVar1 = uVar7 + 1;
      if (uVar1 < (uVar8 & 0x7fffffff)) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,", ",2);
      }
      lVar9 = lVar9 + (histogram->bins).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar7];
      uVar7 = uVar1;
    } while ((uVar8 & 0x7fffffff) != uVar1);
    local_240 = (double)lVar9;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"]\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"b = [",5);
  if ((int)uVar8 < 1) {
    local_258 = 0.0;
  }
  else {
    local_258 = 0.0;
    uVar7 = 1;
    do {
      dVar11 = ((double)(histogram->bins).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar7 - 1] / local_240) * 100.0;
      std::ostream::_M_insert<double>(dVar11);
      if (uVar7 < (uVar8 & 0x7fffffff)) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,", ",2);
      }
      if (local_258 <= dVar11) {
        local_258 = dVar11;
      }
      bVar10 = uVar7 != (uVar8 & 0x7fffffff);
      uVar7 = uVar7 + 1;
    } while (bVar10);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"]\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,"fig = plt.figure(figsize=(3,2))\n",0x20);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,"ax = fig.add_subplot(111)\n",0x1a);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,"ax.set_autoscale_on(False)\n",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"ax.hist(a, ",0xb);
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)&local_230,uVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,", weights=b",0xb);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,", range=(",9);
  poVar6 = std::ostream::_M_insert<double>(histogram->min);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
  poVar6 = std::ostream::_M_insert<double>(histogram->max);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,")\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"ax.axis([",9);
  poVar6 = std::ostream::_M_insert<double>(histogram->min);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
  poVar6 = std::ostream::_M_insert<double>(histogram->max);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"0, ",3);
  poVar6 = std::ostream::_M_insert<double>(local_258);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"])\n",3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"fig.savefig(\'",0xd);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&local_230,(filepath->_M_dataplus)._M_p,filepath->_M_string_length)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\', bbox_inches=\'tight\')\n",0x18);
  std::ofstream::close();
  iVar5 = system("python Omega_h_histogram.py");
  if (iVar5 != 0) {
    fail("assertion %s failed at %s +%d\n","ret == 0",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_histogram.cpp"
         ,0x7e);
  }
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _sqrt;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void render_histogram_matplotlib(
    Histogram const& histogram, std::string const& filepath) {
  std::ofstream script("Omega_h_histogram.py");
  script << "#!/usr/bin/python\n";
  script << "import matplotlib\n";
  script << "# Force matplotlib to not use any Xwindows backend.\n";
  script << "matplotlib.use('Agg')\n";
  script << "import matplotlib.pyplot as plt\n";
  auto nbins = Int(histogram.bins.size());
  auto interval = (histogram.max - histogram.min) / Real(nbins);
  script << "a = [";
  GO total = 0;
  for (Int i = 0; i < nbins; ++i) {
    auto mid = (interval * i) + histogram.min + (interval / 2.0);
    script << mid;
    if (i + 1 < nbins) script << ", ";
    total += histogram.bins[std::size_t(i)];
  }
  script << "]\n";
  script << "b = [";
  Real max_percent = 0.0;
  for (Int i = 0; i < nbins; ++i) {
    auto percent = (Real(histogram.bins[std::size_t(i)]) / Real(total)) * 100.0;
    max_percent = max2(percent, max_percent);
    script << percent;
    if (i + 1 < nbins) script << ", ";
  }
  script << "]\n";
  script << "fig = plt.figure(figsize=(3,2))\n";
  script << "ax = fig.add_subplot(111)\n";
  script << "ax.set_autoscale_on(False)\n";
  script << "ax.hist(a, " << nbins << ", weights=b";
  script << ", range=(" << histogram.min << ", " << histogram.max << ")";
  script << ")\n";
  script << "ax.axis([" << histogram.min << ", " << histogram.max << ", ";
  script << "0, " << max_percent << "])\n";
  script << "fig.savefig('" << filepath << "', bbox_inches='tight')\n";
  script.close();
  int ret = ::system("python Omega_h_histogram.py");
  OMEGA_H_CHECK(ret == 0);
}